

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  DescriptorPool *this_00;
  Symbol SVar1;
  StringPiece local_30;
  
  SVar1 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  if (((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ == '\0')) &&
     (this_00 = this->pool_, this_00->allow_unknown_ == true)) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_30,name);
    SVar1 = DescriptorPool::NewPlaceholderWithMutexHeld(this_00,local_30,placeholder_type);
  }
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const std::string& name, const std::string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}